

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::egl::GLES2ThreadedSharingTest::iterate(GLES2ThreadedSharingTest *this)

{
  bool bVar1;
  undefined8 uVar2;
  IterateResult IVar3;
  int iVar4;
  int iVar5;
  deUint64 dVar6;
  pointer ppEVar7;
  NotSupportedError *this_00;
  pointer ppEVar8;
  char *description;
  qpTestResult testResult;
  uint uVar9;
  bool bVar10;
  ostringstream *poVar11;
  ulong uVar12;
  int threadNdx;
  uint uVar13;
  long lVar14;
  vector<int,_std::allocator<int>_> indices;
  Message message;
  vector<int,_std::allocator<int>_> local_1f0;
  Message local_1d8;
  undefined1 local_1b0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  if (this->m_threadsStarted == false) {
    dVar6 = deGetMicroseconds();
    this->m_beginTimeUs = dVar6;
    ppEVar7 = (this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(this->m_threads).
                                super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar7) >> 3)) {
      lVar14 = 0;
      do {
        tcu::ThreadUtil::Thread::exec(&ppEVar7[lVar14]->super_Thread);
        lVar14 = lVar14 + 1;
        ppEVar7 = (this->m_threads).
                  super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (lVar14 < (int)((ulong)((long)(this->m_threads).
                                            super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)ppEVar7) >> 3));
    }
    this->m_threadsStarted = true;
    this->m_threadsRunning = true;
  }
  else if ((this->m_threadsRunning & 1U) == 0) goto LAB_001d9760;
  ppEVar7 = (this->m_threads).
            super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar13 = (uint)((ulong)((long)(this->m_threads).
                                super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar7) >> 3);
  if ((int)uVar13 < 1) {
    if (uVar13 == 0) goto LAB_001d96cf;
  }
  else {
    uVar12 = 0;
    uVar9 = 0;
    do {
      uVar9 = uVar9 + ((ppEVar7[uVar12]->super_Thread).m_status != THREADSTATUS_RUNNING);
      uVar12 = uVar12 + 1;
    } while ((uVar13 & 0x7fffffff) != uVar12);
    if (uVar9 == uVar13) {
      if (0 < (int)uVar13) {
        lVar14 = 0;
        do {
          de::Thread::join((Thread *)ppEVar7[lVar14]);
          lVar14 = lVar14 + 1;
          ppEVar7 = (this->m_threads).
                    super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        } while (lVar14 < (int)((ulong)((long)(this->m_threads).
                                              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)ppEVar7) >> 3));
      }
LAB_001d96cf:
      this->m_executionReady = true;
      this->m_requiresRestart = false;
    }
  }
  dVar6 = deGetMicroseconds();
  if (this->m_timeOutUs < dVar6 - this->m_beginTimeUs) {
    ppEVar7 = (this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppEVar8 = (this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (0 < (int)((ulong)((long)ppEVar8 - (long)ppEVar7) >> 3)) {
      lVar14 = 0;
      do {
        if ((ppEVar7[lVar14]->super_Thread).m_status != THREADSTATUS_RUNNING) {
          de::Thread::join((Thread *)ppEVar7[lVar14]);
          ppEVar7 = (this->m_threads).
                    super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppEVar8 = (this->m_threads).
                    super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 < (int)((ulong)((long)ppEVar8 - (long)ppEVar7) >> 3));
    }
    this->m_executionReady = true;
    this->m_requiresRestart = true;
    dVar6 = deGetMicroseconds();
    this->m_timeOutTimeUs = dVar6;
  }
  else {
    deSleep(this->m_sleepTimeMs);
  }
LAB_001d9760:
  IVar3 = CONTINUE;
  if (this->m_executionReady == true) {
    local_1b0._0_8_ = (ulong)(uint)local_1b0._4_4_ << 0x20;
    std::vector<int,_std::allocator<int>_>::vector
              (&local_1f0,
               (long)(this->m_threads).
                     super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_threads).
                     super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3,
               (value_type_conflict1 *)local_1b0,(allocator_type *)&local_1d8);
    if (this->m_timeOutTimeUs != 0) {
      local_1b0._0_8_ = this->m_log;
      poVar11 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar11);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar11,
                 "Execution timeout limit reached. Trying to get per thread logs. This is potentially dangerous."
                 ,0x5e);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar11);
      std::ios_base::~ios_base(local_138);
    }
    ppEVar7 = (this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(this->m_threads).
                                super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar7) >> 3)) {
      uVar13 = 0;
      do {
        while( true ) {
          uVar12 = (ulong)uVar13;
          iVar4 = tcu::ThreadUtil::Thread::getMessageCount(&ppEVar7[uVar12]->super_Thread);
          iVar5 = local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar12];
          if (iVar4 <= iVar5) break;
          ppEVar7 = (this->m_threads).
                    super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (0 < (int)((ulong)((long)(this->m_threads).
                                      super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar7) >>
                       3)) {
            lVar14 = 0;
            do {
              iVar5 = tcu::ThreadUtil::Thread::getMessageCount(&ppEVar7[lVar14]->super_Thread);
              if (local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar14] < iVar5) {
                tcu::ThreadUtil::Thread::getMessage
                          ((Message *)local_1b0,
                           &(this->m_threads).
                            super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar14]->super_Thread,
                           local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar14]);
                uVar2 = local_1b0._0_8_;
                dVar6 = this->m_beginTimeUs;
                tcu::ThreadUtil::Thread::getMessage
                          (&local_1d8,
                           &(this->m_threads).
                            super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[(int)uVar13]->super_Thread,
                           local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[(int)uVar13]);
                uVar12 = local_1d8.m_time - this->m_beginTimeUs;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8.m_message._M_dataplus._M_p != &local_1d8.m_message.field_2) {
                  operator_delete(local_1d8.m_message._M_dataplus._M_p,
                                  local_1d8.m_message.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b0._8_8_ != local_198) {
                  operator_delete((void *)local_1b0._8_8_,local_198[0]._M_allocated_capacity + 1);
                }
                if (uVar2 - dVar6 < uVar12) {
                  uVar13 = (uint)lVar14;
                }
              }
              lVar14 = lVar14 + 1;
              ppEVar7 = (this->m_threads).
                        super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            } while (lVar14 < (int)((ulong)((long)(this->m_threads).
                                                  super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)ppEVar7) >> 3));
            uVar12 = (ulong)(int)uVar13;
            iVar5 = local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar12];
          }
          poVar11 = (ostringstream *)(local_1b0 + 8);
          tcu::ThreadUtil::Thread::getMessage(&local_1d8,&ppEVar7[uVar12]->super_Thread,iVar5);
          local_1b0._0_8_ = this->m_log;
          std::__cxx11::ostringstream::ostringstream(poVar11);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar11,"[",1);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar11,"] (",3);
          std::ostream::operator<<(poVar11,uVar13);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar11,") ",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar11,local_1d8.m_message._M_dataplus._M_p,
                     local_1d8.m_message._M_string_length);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar11);
          std::ios_base::~ios_base(local_138);
          local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar12] =
               local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar12] + 1;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8.m_message._M_dataplus._M_p != &local_1d8.m_message.field_2) {
            operator_delete(local_1d8.m_message._M_dataplus._M_p,
                            local_1d8.m_message.field_2._M_allocated_capacity + 1);
          }
          ppEVar7 = (this->m_threads).
                    super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar13 = 0;
          if ((int)((ulong)((long)(this->m_threads).
                                  super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar7) >> 3)
              < 1) goto LAB_001d9a68;
        }
        uVar13 = uVar13 + 1;
        ppEVar7 = (this->m_threads).
                  super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while ((int)uVar13 <
               (int)((ulong)((long)(this->m_threads).
                                   super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar7) >> 3)
              );
    }
LAB_001d9a68:
    if (this->m_timeOutTimeUs != 0) {
      local_1b0._0_8_ = this->m_log;
      poVar11 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar11);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar11,"[",1);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar11,"] Execution timeout limit reached",0x21);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar11);
      std::ios_base::~ios_base(local_138);
    }
    ppEVar7 = (this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar13 = (uint)((ulong)((long)(this->m_threads).
                                  super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar7) >> 3);
    if ((int)uVar13 < 1) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
      bVar1 = true;
      uVar12 = 0;
      bVar10 = false;
      do {
        switch((ppEVar7[uVar12]->super_Thread).m_status) {
        default:
          bVar1 = false;
          break;
        case THREADSTATUS_READY:
          break;
        case THREADSTATUS_NOT_SUPPORTED:
          bVar10 = true;
        }
        uVar12 = uVar12 + 1;
      } while ((uVar13 & 0x7fffffff) != uVar12);
      if (bVar10) {
        this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        tcu::NotSupportedError::NotSupportedError
                  (this_00,"Thread threw tcu::NotSupportedError","",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                   ,0xea5);
        __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
      }
      testResult = (byte)~bVar1 & QP_TEST_RESULT_FAIL;
      description = "Fail";
      if (bVar1) {
        description = "Pass";
      }
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,testResult,description
              );
    if (local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    IVar3 = STOP;
  }
  return IVar3;
}

Assistant:

tcu::TestCase::IterateResult GLES2ThreadedSharingTest::iterate (void)
{
	if (!m_threadsStarted)
	{
		m_beginTimeUs = deGetMicroseconds();

		// Execute threads
		for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
			m_threads[threadNdx]->exec();

		m_threadsStarted = true;
		m_threadsRunning = true;
	}

	if (m_threadsRunning)
	{
		// Wait threads to finish
		int readyThreads = 0;
		for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
		{
			if (m_threads[threadNdx]->getStatus() != tcu::ThreadUtil::Thread::THREADSTATUS_RUNNING)
				readyThreads++;
		}

		if (readyThreads == (int)m_threads.size())
		{
			for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
				m_threads[threadNdx]->join();

			m_executionReady	= true;
			m_requiresRestart	= false;
		}

		if (deGetMicroseconds() - m_beginTimeUs > m_timeOutUs)
		{
			for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
			{
				if (m_threads[threadNdx]->getStatus() != tcu::ThreadUtil::Thread::THREADSTATUS_RUNNING)
					m_threads[threadNdx]->join();
			}
			m_executionReady	= true;
			m_requiresRestart	= true;
			m_timeOutTimeUs		= deGetMicroseconds();
		}
		else
		{
			deSleep(m_sleepTimeMs);
		}
	}

	if (m_executionReady)
	{
		std::vector<int> indices(m_threads.size(), 0);

		if (m_timeOutTimeUs != 0)
			m_log << tcu::TestLog::Message << "Execution timeout limit reached. Trying to get per thread logs. This is potentially dangerous." << tcu::TestLog::EndMessage;

		while (true)
		{
			int			firstThread = -1;

			// Find first thread with messages
			for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
			{
				if (m_threads[threadNdx]->getMessageCount() > indices[threadNdx])
				{
					firstThread = threadNdx;
					break;
				}
			}

			// No more messages
			if (firstThread == -1)
				break;

			for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
			{
				// No more messages in this thread
				if (m_threads[threadNdx]->getMessageCount() <= indices[threadNdx])
					continue;

				if ((m_threads[threadNdx]->getMessage(indices[threadNdx]).getTime() - m_beginTimeUs) < (m_threads[firstThread]->getMessage(indices[firstThread]).getTime() - m_beginTimeUs))
					firstThread = threadNdx;
			}

			tcu::ThreadUtil::Message message = m_threads[firstThread]->getMessage(indices[firstThread]);

			m_log << tcu::TestLog::Message << "[" << (message.getTime() - m_beginTimeUs) << "] (" << firstThread << ") " << message.getMessage() << tcu::TestLog::EndMessage;
			indices[firstThread]++;
		}

		if (m_timeOutTimeUs != 0)
			m_log << tcu::TestLog::Message << "[" << (m_timeOutTimeUs - m_beginTimeUs) << "] Execution timeout limit reached" << tcu::TestLog::EndMessage;

		bool isOk = true;
		bool notSupported = false;

		for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
		{
			const tcu::ThreadUtil::Thread::ThreadStatus status = m_threads[threadNdx]->getStatus();

			switch (status)
			{
				case tcu::ThreadUtil::Thread::THREADSTATUS_FAILED:
				case tcu::ThreadUtil::Thread::THREADSTATUS_INIT_FAILED:
				case tcu::ThreadUtil::Thread::THREADSTATUS_RUNNING:
					isOk = false;
					break;

				case tcu::ThreadUtil::Thread::THREADSTATUS_NOT_SUPPORTED:
					notSupported = true;
					break;

				case tcu::ThreadUtil::Thread::THREADSTATUS_READY:
					// Nothing
					break;

				default:
					DE_ASSERT(false);
					isOk = false;
			};
		}

		if (notSupported)
			throw tcu::NotSupportedError("Thread threw tcu::NotSupportedError", "", __FILE__, __LINE__);

		if (isOk)
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

		return STOP;
	}

	return CONTINUE;
}